

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O1

void close_socket(uv_os_sock_t sock)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  undefined4 in_register_0000003c;
  long *plVar5;
  code **ppcVar6;
  code *pcStack_28;
  undefined8 uStack_20;
  long lStack_18;
  
  plVar5 = (long *)CONCAT44(in_register_0000003c,sock);
  iVar2 = close(sock);
  if (iVar2 == 0) {
    return;
  }
  piVar3 = __errno_location();
  if (*piVar3 == 0x68) {
    return;
  }
  close_socket_cold_1();
  lVar1 = *plVar5;
  pcStack_28 = (code *)0x1b697f;
  iVar2 = uv_is_active();
  lStack_18 = (long)iVar2;
  uStack_20 = 0;
  if (lStack_18 == 0) {
    if (*(uint *)(lVar1 + 0x128) == 0) goto LAB_001b69f5;
    uVar4 = *(uint *)(lVar1 + 0x128) | *(uint *)(lVar1 + 0x124);
    *(uint *)(lVar1 + 0x124) = uVar4;
    *(undefined4 *)(lVar1 + 0x128) = 0;
    pcStack_28 = (code *)0x1b69c8;
    iVar2 = uv_poll_start(lVar1,uVar4,connection_poll_cb);
    lStack_18 = (long)iVar2;
    uStack_20 = 0;
    if (lStack_18 == 0) {
      return;
    }
  }
  else {
    pcStack_28 = (code *)0x1b69f5;
    delay_timer_cb_cold_1();
LAB_001b69f5:
    pcStack_28 = (code *)0x1b69fa;
    delay_timer_cb_cold_3();
  }
  plVar5 = &lStack_18;
  pcStack_28 = connection_close_cb;
  delay_timer_cb_cold_2();
  ppcVar6 = (code **)*plVar5;
  piVar3 = (int *)((long)ppcVar6 + 0x114);
  *piVar3 = *piVar3 + -1;
  if (*piVar3 != 0) {
    return;
  }
  if ((test_mode == '\x01') && (*(int *)(ppcVar6 + 0x22) == 0)) {
    pcStack_28 = ppcVar6[0x20];
    if (pcStack_28 != (code *)0x0) {
      connection_close_cb_cold_2();
LAB_001b6af8:
      connection_close_cb_cold_1();
      goto LAB_001b6b07;
    }
  }
  else {
    pcStack_28 = ppcVar6[0x20];
    if (pcStack_28 != (code *)0x10000) goto LAB_001b6af8;
  }
  if ((test_mode != '\0') && (*(int *)(ppcVar6 + 0x22) != 0)) {
    pcStack_28 = ppcVar6[0x21];
    if (pcStack_28 == (code *)0x0) goto LAB_001b6ab5;
    ppcVar6 = &pcStack_28;
    connection_close_cb_cold_3();
  }
  pcStack_28 = ppcVar6[0x21];
  if (pcStack_28 != (code *)0x10000) {
LAB_001b6b07:
    ppcVar6 = &pcStack_28;
    connection_close_cb_cold_4();
    free(*ppcVar6);
    return;
  }
LAB_001b6ab5:
  closed_connections = closed_connections + 1;
  free(ppcVar6);
  return;
}

Assistant:

static void close_socket(uv_os_sock_t sock) {
  int r;
#ifdef _WIN32
  r = closesocket(sock);
#else
  r = close(sock);
#endif
  /* On FreeBSD close() can fail with ECONNRESET if the socket was shutdown by
   * the peer before all pending data was delivered.
   */
  ASSERT(r == 0 || errno == ECONNRESET);
}